

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

bool __thiscall
EthBasePort::WriteQuadletNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t data,uchar flags)

{
  int iVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  EthBasePort *this_00;
  uchar *puVar3;
  long *local_50 [2];
  long local_40 [2];
  
  if ((int)CONCAT62(in_register_00000032,node) != 0x3f) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"WriteQuadlet","");
    iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,(string *)local_50,0);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  BasePort::SetGenericBuffer(&this->super_BasePort);
  puVar3 = (this->super_BasePort).GenericBuffer;
  uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
  puVar3 = puVar3 + uVar2;
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  this->fw_tl = this->fw_tl + 1 & 0x3f;
  (*(this->super_BasePort)._vptr_BasePort[0x31])(this,puVar3,(ulong)(iVar1 + 0x14U),node,flags);
  uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,0);
  puVar3[uVar2] = '\0';
  if (((flags & 0x40) != 0) || (this->useFwBridge == false)) {
    puVar3[uVar2] = '\x01';
  }
  puVar3[uVar2 + 1] = (uchar)(this->super_BasePort).FwBusGeneration;
  this_00 = this;
  uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  make_qwrite_packet(this_00,(quadlet_t *)(puVar3 + uVar2),node,addr,data,(uint)this->fw_tl);
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                    (this,node,puVar3,(ulong)(iVar1 + 0x14U),(ulong)(flags >> 7));
  return (bool)(char)iVar1;
}

Assistant:

bool EthBasePort::WriteQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t data, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("WriteQuadlet"))
        return false;

    // Use GenericBuffer, which is much larger than needed
    SetGenericBuffer();   // Make sure buffer is allocated
    unsigned char *packet = GenericBuffer+GetWriteQuadAlign();
    unsigned int packetSize = GetPrefixOffset(WR_FW_HEADER)+FW_QWRITE_SIZE;

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(packet, packetSize, node, flags);

    // Make control word
    make_write_header(packet, packetSize, flags);

    // Build FireWire packet (also byteswaps data)
    make_qwrite_packet(reinterpret_cast<quadlet_t *>(packet+GetPrefixOffset(WR_FW_HEADER)), node, addr, data, fw_tl);

    return PacketSend(node, packet, packetSize, flags&FW_NODE_ETH_BROADCAST_MASK);
}